

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O2

void __thiscall
CryptoUtil_DecryptAes256CbcToStringDataSizeError_Test::TestBody
          (CryptoUtil_DecryptAes256CbcToStringDataSizeError_Test *this)

{
  ByteData *in_R8;
  char *in_R9;
  string result;
  ByteData iv;
  ByteData key;
  ByteData data;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  std::__cxx11::string::string
            ((string *)&result,"616975656F616975656F616975656F616975656F616975656F616975656F6169",
             (allocator *)&iv);
  cfd::core::ByteData::ByteData(&key,&result);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::string
            ((string *)&result,"33343536373839303132333435363738",(allocator *)&data);
  cfd::core::ByteData::ByteData(&iv,&result);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::string
            ((string *)&result,"2ef199bb7d160f94fc17fa5f01b220c630d6b19a5973f4b313868c921fc10d",
             (allocator *)&local_40);
  cfd::core::ByteData::ByteData(&data,&result);
  std::__cxx11::string::~string((string *)&result);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,&key);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28,&iv);
  cfd::core::CryptoUtil::DecryptAes256CbcToString_abi_cxx11_
            ((string *)&result,(CryptoUtil *)&local_40,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28,&data.data_,in_R8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_28);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  std::__cxx11::string::~string((string *)&result);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&iv);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
  key.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0;
  key.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  testing::Message::Message((Message *)&iv);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&result,(internal *)&key,(AssertionResult *)0x43d6e7,"false","true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&data,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_cryptoutil.cpp"
             ,0x16d,result._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=((AssertHelper *)&data,(Message *)&iv);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&data);
  std::__cxx11::string::~string((string *)&result);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&iv);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&key.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

TEST(CryptoUtil, DecryptAes256CbcToStringDataSizeError) {
  try {
    ByteData key(
        "616975656F616975656F616975656F616975656F616975656F616975656F6169");
    ByteData iv("33343536373839303132333435363738");
    ByteData data(
        "2ef199bb7d160f94fc17fa5f01b220c630d6b19a5973f4b313868c921fc10d");
    std::string result = CryptoUtil::DecryptAes256CbcToString(key.GetBytes(),
                                                              iv.GetBytes(),
                                                              data);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "DecryptAes256Cbc error.");
    return;
  }
  ASSERT_TRUE(false);
}